

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::fillWithComponentGradients(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  undefined8 uVar1;
  ChannelOrder CVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int y;
  int iVar6;
  float fVar7;
  float fVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_a8 [16];
  PixelBufferAccess local_98;
  undefined1 local_68 [16];
  Vec4 local_58;
  Vec4 local_48;
  
  uVar3 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((0x25 < uVar3) || ((0x2007000000U >> (uVar3 & 0x3f) & 1) == 0)) {
    iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (iVar5 == 1) {
      if (iVar4 == 1) {
        iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        if (iVar5 < 1) {
          return;
        }
        iVar4 = 0;
        do {
          fVar7 = ((float)iVar4 + 0.5) / (float)iVar5;
          local_98.super_ConstPixelBufferAccess.m_format.order =
               (ChannelOrder)(fVar7 * (maxVal->m_data[0] - minVal->m_data[0]) + minVal->m_data[0]);
          local_98.super_ConstPixelBufferAccess.m_format.type =
               (ChannelType)(fVar7 * (maxVal->m_data[1] - minVal->m_data[1]) + minVal->m_data[1]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
               (int)(fVar7 * (maxVal->m_data[2] - minVal->m_data[2]) + minVal->m_data[2]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
               (int)(fVar7 * (maxVal->m_data[3] - minVal->m_data[3]) + minVal->m_data[3]);
          PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar4,0,0);
          iVar4 = iVar4 + 1;
          iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        } while (iVar4 < iVar5);
        return;
      }
    }
    else if (iVar4 == 1) {
      if (iVar5 < 1) {
        return;
      }
      iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
      iVar6 = 0;
      do {
        if (0 < iVar4) {
          auVar11._0_4_ = (float)iVar6 + 0.5;
          iVar5 = 0;
          do {
            auVar8._0_4_ = (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
            auVar8._4_4_ = (float)iVar4;
            auVar8._8_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[0];
            auVar8._12_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[1];
            auVar11._4_4_ = (float)iVar5 + 0.5;
            auVar11._8_8_ = 0;
            auVar8 = divps(auVar11,auVar8);
            fVar7 = auVar8._0_4_;
            fVar9 = auVar8._4_4_;
            local_98.super_ConstPixelBufferAccess.m_format.order =
                 (ChannelOrder)
                 ((maxVal->m_data[0] - minVal->m_data[0]) * (fVar7 + fVar9) * 0.5 +
                 minVal->m_data[0]);
            local_98.super_ConstPixelBufferAccess.m_format.type =
                 (ChannelType)
                 ((maxVal->m_data[1] - minVal->m_data[1]) * (fVar9 + (1.0 - fVar7)) * 0.5 +
                 minVal->m_data[1]);
            local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
                 (int)((maxVal->m_data[2] - minVal->m_data[2]) * (fVar7 + (1.0 - fVar9)) * 0.5 +
                      minVal->m_data[2]);
            local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
                 (int)((maxVal->m_data[3] - minVal->m_data[3]) *
                       ((1.0 - fVar9) + (1.0 - fVar7)) * 0.5 + minVal->m_data[3]);
            PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar5,iVar6,0);
            iVar5 = iVar5 + 1;
            iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (iVar5 < iVar4);
          iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar5);
      return;
    }
    if (iVar4 < 1) {
      return;
    }
    iVar6 = 0;
    do {
      if (0 < iVar5) {
        local_68 = ZEXT416((uint)((float)iVar6 + 0.5));
        iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        y = 0;
        do {
          if (0 < iVar4) {
            local_a8._4_4_ = local_68._0_4_;
            local_a8._0_4_ = (float)y + 0.5;
            local_a8._8_4_ = 0;
            local_a8._12_4_ = local_68._4_4_;
            iVar5 = 0;
            do {
              fVar7 = ((float)iVar5 + 0.5) / (float)iVar4;
              uVar1 = *(undefined8 *)((access->super_ConstPixelBufferAccess).m_size.m_data + 1);
              auVar10._0_4_ = (float)(int)uVar1;
              auVar10._4_4_ = (float)(int)((ulong)uVar1 >> 0x20);
              auVar10._8_8_ = 0;
              auVar11 = divps(local_a8,auVar10);
              local_98.super_ConstPixelBufferAccess.m_format.order =
                   (ChannelOrder)
                   (fVar7 * (maxVal->m_data[0] - minVal->m_data[0]) + minVal->m_data[0]);
              local_98.super_ConstPixelBufferAccess.m_format.type =
                   (ChannelType)
                   (auVar11._0_4_ * (maxVal->m_data[1] - minVal->m_data[1]) + minVal->m_data[1]);
              local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
                   (int)(auVar11._4_4_ * (maxVal->m_data[2] - minVal->m_data[2]) + minVal->m_data[2]
                        );
              local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
                   (int)(((auVar11._4_4_ + fVar7 + auVar11._0_4_) / -3.0 + 1.0) *
                         (maxVal->m_data[3] - minVal->m_data[3]) + minVal->m_data[3]);
              PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar5,y,iVar6);
              iVar5 = iVar5 + 1;
              iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            } while (iVar5 < iVar4);
            iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
          }
          y = y + 1;
        } while (y < iVar5);
        iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar4);
    return;
  }
  CVar2 = (access->super_ConstPixelBufferAccess).m_format.order;
  if (CVar2 == DS) {
    getEffectiveDepthStencilAccess(&local_98,access,MODE_DEPTH);
    fillWithComponentGradients(&local_98,minVal,maxVal);
  }
  else if (CVar2 != S) {
    if (CVar2 != D) {
      return;
    }
    getEffectiveDepthStencilAccess(&local_98,access,MODE_DEPTH);
    goto LAB_001f051f;
  }
  getEffectiveDepthStencilAccess(&local_98,access,MODE_STENCIL);
  local_48.m_data[3] = minVal->m_data[0];
  local_48.m_data[2] = minVal->m_data[1];
  local_48.m_data[1] = minVal->m_data[2];
  local_48.m_data[0] = minVal->m_data[3];
  minVal = &local_48;
  local_58.m_data[3] = maxVal->m_data[0];
  local_58.m_data[2] = maxVal->m_data[1];
  local_58.m_data[1] = maxVal->m_data[2];
  local_58.m_data[0] = maxVal->m_data[3];
  maxVal = &local_58;
LAB_001f051f:
  fillWithComponentGradients(&local_98,minVal,maxVal);
  return;
}

Assistant:

void fillWithComponentGradients (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), minVal, maxVal);
		if (hasStencil)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), minVal.swizzle(3,2,1,0), maxVal.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithComponentGradients1D(access, minVal, maxVal);
		else if (access.getDepth() == 1)
			fillWithComponentGradients2D(access, minVal, maxVal);
		else
			fillWithComponentGradients3D(access, minVal, maxVal);
	}
}